

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::languageCodeList(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *pAVar1;
  int iVar2;
  NoViableAltException *this_01;
  RefAST tmp177_AST;
  RefAST tmp174_AST;
  RefAST tmp176_AST;
  RefAST tmp172_AST;
  RefAST languageCodeList_AST;
  ASTPair currentAST;
  RefCount<Token> local_90;
  RefCount<Token> local_88;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefToken local_70;
  RefAST local_68;
  RefCount<AST> local_60;
  RefAST local_58;
  RefAST local_50;
  RefCount<Token> local_48;
  ASTFactory local_40;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  languageCodeList_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  tmp172_AST = nullAST;
  if (iVar2 == 6) {
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    ASTFactory::create((ASTFactory *)&tmp174_AST,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&tmp172_AST,&tmp174_AST);
    RefCount<AST>::~RefCount(&tmp174_AST);
    RefCount<Token>::~RefCount(&local_80);
    Parser::match((Parser *)this,6);
    tmp174_AST = nullAST;
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
    ASTFactory::create((ASTFactory *)&tmp177_AST,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&tmp174_AST,&tmp177_AST);
    RefCount<AST>::~RefCount(&tmp177_AST);
    RefCount<Token>::~RefCount(&local_88);
    if (tmp174_AST.ref != (Ref *)0x0) {
      (tmp174_AST.ref)->count = (tmp174_AST.ref)->count + 1;
    }
    local_58.ref = tmp174_AST.ref;
    ASTFactory::addASTChild(pAVar1,&currentAST,&local_58);
    RefCount<AST>::~RefCount(&local_58);
    Parser::match((Parser *)this,0x14);
    while( true ) {
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      tmp177_AST = nullAST;
      if (iVar2 != 0x15) break;
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_40.nodeFactory,this,1);
      ASTFactory::create((ASTFactory *)&tmp176_AST,(RefToken *)pAVar1);
      RefCount<AST>::operator=(&tmp177_AST,(RefCount<AST> *)&tmp176_AST);
      RefCount<AST>::~RefCount((RefCount<AST> *)&tmp176_AST);
      RefCount<Token>::~RefCount((RefCount<Token> *)&local_40.nodeFactory);
      Parser::match((Parser *)this,0x15);
      tmp176_AST = nullAST;
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
      ASTFactory::create(&local_40,(RefToken *)pAVar1);
      RefCount<AST>::operator=((RefCount<AST> *)&tmp176_AST,(RefCount<AST> *)&local_40);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_40);
      RefCount<Token>::~RefCount(&local_48);
      if (tmp176_AST.ref != (Ref *)0x0) {
        (tmp176_AST.ref)->count = (tmp176_AST.ref)->count + 1;
      }
      local_60.ref = tmp176_AST.ref;
      ASTFactory::addASTChild(pAVar1,&currentAST,&local_60);
      RefCount<AST>::~RefCount(&local_60);
      Parser::match((Parser *)this,0x14);
      RefCount<AST>::~RefCount((RefCount<AST> *)&tmp176_AST);
      RefCount<AST>::~RefCount(&tmp177_AST);
    }
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90,this,1);
    ASTFactory::create((ASTFactory *)&tmp176_AST,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&tmp177_AST,&tmp176_AST);
    RefCount<AST>::~RefCount(&tmp176_AST);
    RefCount<Token>::~RefCount(&local_90);
    if (tmp177_AST.ref != (Ref *)0x0) {
      (tmp177_AST.ref)->count = (tmp177_AST.ref)->count + 1;
    }
    local_68.ref = tmp177_AST.ref;
    ASTFactory::addASTChild(pAVar1,&currentAST,&local_68);
    RefCount<AST>::~RefCount(&local_68);
    Parser::match((Parser *)this,7);
    RefCount<AST>::~RefCount(&tmp177_AST);
    RefCount<AST>::~RefCount(&tmp174_AST);
  }
  else {
    if (iVar2 != 0x14) {
      this_01 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70,this,1);
      NoViableAltException::NoViableAltException(this_01,&local_70);
      __cxa_throw(this_01,&NoViableAltException::typeinfo,
                  NoViableAltException::~NoViableAltException);
    }
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    ASTFactory::create((ASTFactory *)&tmp174_AST,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&tmp172_AST,&tmp174_AST);
    RefCount<AST>::~RefCount(&tmp174_AST);
    RefCount<Token>::~RefCount(&local_78);
    if (tmp172_AST.ref != (Ref *)0x0) {
      (tmp172_AST.ref)->count = (tmp172_AST.ref)->count + 1;
    }
    local_50.ref = tmp172_AST.ref;
    ASTFactory::addASTChild(pAVar1,&currentAST,&local_50);
    RefCount<AST>::~RefCount(&local_50);
    Parser::match((Parser *)this,0x14);
  }
  RefCount<AST>::~RefCount(&tmp172_AST);
  RefCount<AST>::operator=(&languageCodeList_AST,&currentAST.root);
  RefCount<AST>::operator=(this_00,&languageCodeList_AST);
  RefCount<AST>::~RefCount(&languageCodeList_AST);
  ASTPair::~ASTPair(&currentAST);
  return;
}

Assistant:

void GrpParser::languageCodeList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST languageCodeList_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case LIT_STRING:
		{
			RefAST tmp172_AST = nullAST;
			tmp172_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp172_AST);
			match(LIT_STRING);
			break;
		}
		case OP_LPAREN:
		{
			RefAST tmp173_AST = nullAST;
			tmp173_AST = astFactory.create(LT(1));
			match(OP_LPAREN);
			RefAST tmp174_AST = nullAST;
			tmp174_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp174_AST);
			match(LIT_STRING);
			{
			do {
				if ((LA(1)==OP_COMMA)) {
					RefAST tmp175_AST = nullAST;
					tmp175_AST = astFactory.create(LT(1));
					match(OP_COMMA);
					RefAST tmp176_AST = nullAST;
					tmp176_AST = astFactory.create(LT(1));
					astFactory.addASTChild(currentAST, tmp176_AST);
					match(LIT_STRING);
				}
				else {
					goto _loop182;
				}
				
			} while (true);
			_loop182:;
			}
			RefAST tmp177_AST = nullAST;
			tmp177_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp177_AST);
			match(OP_RPAREN);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		languageCodeList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_45);
	}
	returnAST = languageCodeList_AST;
}